

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

int quicly_sentmap_prepare
              (quicly_sentmap_t *map,uint64_t packet_number,int64_t now,uint8_t ack_epoch)

{
  long lVar1;
  quicly_sent_t *pqVar2;
  undefined1 in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  quicly_sent_acked_cb in_stack_ffffffffffffffc0;
  quicly_sentmap_t *in_stack_ffffffffffffffc8;
  undefined1 uStack_2f;
  undefined4 uStack_2c;
  int local_4;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    pqVar2 = quicly_sentmap_allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    *(quicly_sent_t **)(in_RDI + 0x20) = pqVar2;
    if (pqVar2 == (quicly_sent_t *)0x0) {
      local_4 = 0x201;
    }
    else {
      lVar1 = *(long *)(in_RDI + 0x20);
      *(undefined8 *)(lVar1 + 8) = in_RSI;
      *(undefined8 *)(lVar1 + 0x10) = in_RDX;
      *(ulong *)(lVar1 + 0x18) = CONCAT44(uStack_2c,(uint)(CONCAT11(uStack_2f,in_CL) & 0xfcff));
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("map->_pending_packet == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                ,0x61,"int quicly_sentmap_prepare(quicly_sentmap_t *, uint64_t, int64_t, uint8_t)");
}

Assistant:

int quicly_sentmap_prepare(quicly_sentmap_t *map, uint64_t packet_number, int64_t now, uint8_t ack_epoch)
{
    assert(map->_pending_packet == NULL);

    if ((map->_pending_packet = quicly_sentmap_allocate(map, quicly_sentmap__type_packet)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    map->_pending_packet->data.packet = (quicly_sent_packet_t){packet_number, now, ack_epoch};
    return 0;
}